

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.hpp
# Opt level: O0

void __thiscall
boost::lockfree::detail::
runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node>>
::
runtime_sized_freelist_storage<std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node>>
          (runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
           *this,allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>
                 *alloc,size_t count)

{
  pointer pvVar1;
  ulong in_RDX;
  aligned_allocator_adaptor<std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>,_64UL>
  *in_RDI;
  size_type in_stack_00000008;
  aligned_allocator_adaptor<std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>,_64UL>
  *in_stack_00000010;
  allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>
  *in_stack_ffffffffffffffb8;
  runtime_error *in_stack_ffffffffffffffd0;
  runtime_error local_28 [16];
  ulong local_18;
  
  local_18 = in_RDX;
  alignment::
  aligned_allocator_adaptor<std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node>,64ul>
  ::
  aligned_allocator_adaptor<std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node>const&>
            (in_RDI,in_stack_ffffffffffffffb8);
  *(ulong *)(in_RDI + 8) = local_18;
  if (0xffff < local_18) {
    std::runtime_error::runtime_error
              (local_28,"boost.lockfree: freelist size is limited to a maximum of 65535 objects");
    throw_exception<std::runtime_error>(in_stack_ffffffffffffffd0);
  }
  pvVar1 = alignment::
           aligned_allocator_adaptor<std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>,_64UL>
           ::allocate(in_stack_00000010,in_stack_00000008);
  *(pointer *)in_RDI = pvVar1;
  return;
}

Assistant:

runtime_sized_freelist_storage(Allocator const & alloc, std::size_t count):
        allocator_type(alloc), node_count_(count)
    {
        if (count > 65535)
            boost::throw_exception(std::runtime_error("boost.lockfree: freelist size is limited to a maximum of 65535 objects"));
        nodes_ = allocator_type::allocate(count);
    }